

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O1

void __thiscall
ItemSourceShop::ItemSourceShop
          (ItemSourceShop *this,string *name,vector<Entity_*,_std::allocator<Entity_*>_> *entities,
          uint8_t shop_item_id,string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ppEVar1 = (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppEVar3 = (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (entities->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ItemSource::ItemSource((ItemSource *)this,name,node_id,hints);
  (this->super_ItemSourceOnGround)._entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppEVar1;
  (this->super_ItemSourceOnGround)._entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar2;
  (this->super_ItemSourceOnGround)._entities.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar3;
  (this->super_ItemSourceOnGround)._ground_item_id = shop_item_id;
  (this->super_ItemSourceOnGround).super_ItemSource._vptr_ItemSource =
       (_func_int **)&PTR__ItemSourceOnGround_00261758;
  *(undefined2 *)&(this->super_ItemSourceOnGround).field_0x82 = 1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"owned by someone trying to make profit out of it","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_ItemSourceOnGround).super_ItemSource._hints,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ItemSourceShop(const std::string& name, std::vector<Entity*> entities, uint8_t shop_item_id, const std::string& node_id = "",
                    const std::vector<std::string>& hints = {}) :
        ItemSourceOnGround (name, std::move(entities), shop_item_id, node_id, hints, false)
    {
        this->add_hint("owned by someone trying to make profit out of it");
    }